

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array.cpp
# Opt level: O0

bool __thiscall ON_UuidPtrList2::FindUuid(ON_UuidPtrList2 *this,ON_UUID *uuid,ON__UINT_PTR *index)

{
  bool bVar1;
  unordered_map<ON_UUID_struct,_unsigned_long,_ON_UuidList2_Private<unsigned_long>::UuidHasher,_std::equal_to<ON_UUID_struct>,_std::allocator<std::pair<const_ON_UUID_struct,_unsigned_long>_>_>
  *puVar2;
  pointer ppVar3;
  _Node_iterator_base<std::pair<const_ON_UUID_struct,_unsigned_long>,_true> local_38;
  _Node_iterator_base<std::pair<const_ON_UUID_struct,_unsigned_long>,_true> local_30;
  iterator it;
  ON__UINT_PTR *index_local;
  ON_UUID *uuid_local;
  ON_UuidPtrList2 *this_local;
  
  it.super__Node_iterator_base<std::pair<const_ON_UUID_struct,_unsigned_long>,_true>._M_cur =
       (_Node_iterator_base<std::pair<const_ON_UUID_struct,_unsigned_long>,_true>)
       (_Node_iterator_base<std::pair<const_ON_UUID_struct,_unsigned_long>,_true>)index;
  puVar2 = (unordered_map<ON_UUID_struct,_unsigned_long,_ON_UuidList2_Private<unsigned_long>::UuidHasher,_std::equal_to<ON_UUID_struct>,_std::allocator<std::pair<const_ON_UUID_struct,_unsigned_long>_>_>
            *)std::
              unique_ptr<ON_UuidPtrList2_Private,_std::default_delete<ON_UuidPtrList2_Private>_>::
              operator->(&this->m_private);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<ON_UUID_struct,_unsigned_long,_ON_UuidList2_Private<unsigned_long>::UuidHasher,_std::equal_to<ON_UUID_struct>,_std::allocator<std::pair<const_ON_UUID_struct,_unsigned_long>_>_>
       ::find(puVar2,uuid);
  puVar2 = (unordered_map<ON_UUID_struct,_unsigned_long,_ON_UuidList2_Private<unsigned_long>::UuidHasher,_std::equal_to<ON_UUID_struct>,_std::allocator<std::pair<const_ON_UUID_struct,_unsigned_long>_>_>
            *)std::
              unique_ptr<ON_UuidPtrList2_Private,_std::default_delete<ON_UuidPtrList2_Private>_>::
              operator->(&this->m_private);
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<ON_UUID_struct,_unsigned_long,_ON_UuidList2_Private<unsigned_long>::UuidHasher,_std::equal_to<ON_UUID_struct>,_std::allocator<std::pair<const_ON_UUID_struct,_unsigned_long>_>_>
       ::end(puVar2);
  bVar1 = std::__detail::operator!=(&local_30,&local_38);
  if (bVar1) {
    if (it.super__Node_iterator_base<std::pair<const_ON_UUID_struct,_unsigned_long>,_true>._M_cur !=
        (__node_type *)0x0) {
      ppVar3 = std::__detail::
               _Node_iterator<std::pair<const_ON_UUID_struct,_unsigned_long>,_false,_true>::
               operator->((_Node_iterator<std::pair<const_ON_UUID_struct,_unsigned_long>,_false,_true>
                           *)&local_30);
      *(unsigned_long *)
       it.super__Node_iterator_base<std::pair<const_ON_UUID_struct,_unsigned_long>,_true>._M_cur =
           ppVar3->second;
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_UuidPtrList2::FindUuid(const ON_UUID& uuid, ON__UINT_PTR* index) const
{
  const auto it = m_private->map.find(uuid);

  if (it != m_private->map.end())
  {
    if (index)
    {
      *index = it->second;
    }
    return true;
  }
  return false;
}